

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O0

bool tinyusdz::detail::ParseMaterialXValue<std::array<float,2ul>>
               (string *str,array<float,_2UL> *value,string *err)

{
  bool bVar1;
  uint8_t *binary;
  uint64_t length;
  array<float,_2UL> local_518;
  array<float,_2UL> val;
  AsciiParser parser;
  StreamReader sr;
  string *err_local;
  array<float,_2UL> *value_local;
  string *str_local;
  
  binary = (uint8_t *)::std::__cxx11::string::data();
  length = ::std::__cxx11::string::size();
  StreamReader::StreamReader((StreamReader *)&parser._primspec_fun._M_invoker,binary,length,false);
  ascii::AsciiParser::AsciiParser
            ((AsciiParser *)&val,(StreamReader *)&parser._primspec_fun._M_invoker);
  memset(&local_518,0,8);
  bVar1 = ParseValue<std::array<float,2ul>>((AsciiParser *)&val,&local_518,err);
  if (bVar1) {
    *(array<float,_2UL> *)value->_M_elems = local_518;
  }
  ascii::AsciiParser::~AsciiParser((AsciiParser *)&val);
  return bVar1;
}

Assistant:

bool ParseMaterialXValue(const std::string &str, T *value, std::string *err) {
  tinyusdz::StreamReader sr(reinterpret_cast<const uint8_t *>(str.data()),
                            str.size(), /* swap endian */ false);
  tinyusdz::ascii::AsciiParser parser(&sr);

  T val{};

  if (!ParseValue(parser, val, err)) {
    return false;
  }

  (*value) = val;
  return true;
}